

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

void __thiscall Samba::writeXmodem(Samba *this,uint8_t *buffer,int size)

{
  byte *pbVar1;
  SerialPort *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  uint8_t blk [133];
  byte local_b8 [131];
  undefined1 local_35;
  undefined1 local_34;
  
  iVar11 = 0;
  do {
    iVar4 = (*((this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    if (iVar4 == 0x43) goto LAB_0010c200;
    iVar11 = iVar11 + 1;
  } while (iVar11 != 5);
  iVar11 = 5;
LAB_0010c200:
  if (iVar11 != 5) {
    if (0 < size) {
      bVar9 = 1;
      uVar10 = (ulong)(uint)size;
      do {
        local_b8[0] = 1;
        local_b8[2] = ~bVar9;
        __n = 0x80;
        if ((int)uVar10 < 0x80) {
          __n = uVar10 & 0xffffffff;
        }
        local_b8[1] = bVar9;
        memcpy(local_b8 + 3,buffer,__n);
        if ((long)uVar10 < 0x80) {
          memset(local_b8 + uVar10 + 3,0,0x80 - uVar10);
        }
        lVar5 = 3;
        uVar7 = 0;
        do {
          uVar8 = uVar7 & 0xffff;
          pbVar1 = local_b8 + lVar5;
          lVar5 = lVar5 + 1;
          uVar7 = uVar7 << 8 ^ (uint)crc16Table[(uint)*pbVar1 ^ uVar8 >> 8];
        } while (lVar5 != 0x83);
        local_35 = (undefined1)(uVar7 >> 8);
        local_34 = (undefined1)crc16Table[(uint)*pbVar1 ^ uVar8 >> 8];
        iVar11 = 0;
        do {
          pSVar2 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          iVar4 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_b8,0x85);
          if (iVar4 != 0x85) goto LAB_0010c359;
          iVar4 = (*((this->_port)._M_t.
                     super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                     super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                     super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])
                            ();
          if (iVar4 == 6) goto LAB_0010c2f1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 5);
        iVar11 = 5;
LAB_0010c2f1:
        if (iVar11 == 5) goto LAB_0010c359;
        buffer = buffer + 0x80;
        bVar9 = bVar9 + 1;
        bVar3 = 0x80 < (long)uVar10;
        uVar10 = uVar10 - 0x80;
      } while (bVar3);
    }
    iVar11 = 0;
    do {
      pSVar2 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar2->_vptr_SerialPort[8])(pSVar2,4);
      iVar4 = (*((this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
      if (iVar4 == 6) goto LAB_0010c342;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 5);
    iVar11 = 5;
LAB_0010c342:
    if (iVar11 != 5) {
      return;
    }
  }
LAB_0010c359:
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_001195a0;
  __cxa_throw(puVar6,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::writeXmodem(const uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == START)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();

    while (size > 0)
    {
        blk[0] = SOH;
        blk[1] = (blkNum & 0xff);
        blk[2] = ~(blkNum & 0xff);
        memmove(&blk[3], buffer, min(size, BLK_SIZE));
        if (size < BLK_SIZE)
            memset(&blk[3] + size, 0, BLK_SIZE - size);
        crc16Add(blk);

        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            bytes = _port->write(blk, sizeof(blk));
            if (bytes != sizeof(blk))
                throw SambaError();

            if (_port->get() == ACK)
                break;
        }

        if (retries == MAX_RETRIES)
            throw SambaError();

        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        _port->put(EOT);
        if (_port->get() == ACK)
            break;
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}